

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

bool __thiscall EOPlus::Parser::GetToken(Parser *this,Token *t,uint allow)

{
  bool bVar1;
  pointer this_00;
  Token local_70;
  uint local_1c;
  Token *pTStack_18;
  uint allow_local;
  Token *t_local;
  Parser *this_local;
  
  local_1c = allow;
  pTStack_18 = t;
  t_local = (Token *)this;
  this_00 = std::
            unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
            ::operator->(&this->tok);
  Parser_Token_Server_Base::GetToken(&local_70,this_00,local_1c);
  Token::operator=(pTStack_18,&local_70);
  Token::~Token(&local_70);
  bVar1 = Token::operator_cast_to_bool(pTStack_18);
  return bVar1;
}

Assistant:

bool GetToken(Token& t, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);
				return bool(t);
			}